

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gvar2.c
# Opt level: O3

LispPTR N_OP_rplptr(LispPTR tos_m_1,LispPTR tos,uint alpha)

{
  DLword *pDVar1;
  uint ptr;
  uint uVar2;
  
  uVar2 = alpha + tos_m_1;
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
  }
  pDVar1 = Lisp_world;
  if ((-1 < *(short *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(tos,0);
    }
    else {
      htfind(tos,0);
    }
  }
  if ((-1 < *(short *)((ulong)(*(uint *)(pDVar1 + uVar2) >> 8 & 0xffffe) + (long)MDStypetbl ^ 2)) &&
     (*GcDisabled_word != 0x4c)) {
    ptr = *(uint *)(pDVar1 + uVar2) & 0xfffffff;
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(ptr,1);
    }
    else {
      htfind(ptr,1);
    }
  }
  *(uint *)(pDVar1 + uVar2) = *(uint *)(pDVar1 + uVar2) & 0xf0000000 | tos & 0xfffffff;
  return tos_m_1;
}

Assistant:

LispPTR N_OP_rplptr(LispPTR tos_m_1, LispPTR tos, unsigned int alpha) {
  struct xpointer *pslot;

  pslot = (struct xpointer *)NativeAligned4FromLAddr(tos_m_1 + alpha);
  FRPLPTR(pslot->addr, tos);
  return (tos_m_1);
}